

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  string *name;
  TestResult *in_RSI;
  ostream *in_RDI;
  allocator<char> *in_stack_fffffffffffff7e0;
  ostream *__a;
  char *in_stack_fffffffffffff7e8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_stack_fffffffffffff888;
  string *value;
  string *in_stack_fffffffffffff890;
  string *in_stack_fffffffffffff898;
  string *element_name;
  ostream *in_stack_fffffffffffff8a0;
  ostream *stream_00;
  allocator<char> *ms;
  string local_690 [39];
  allocator<char> local_669;
  string local_668 [39];
  allocator<char> local_641;
  string local_640 [32];
  string local_620 [39];
  allocator<char> local_5f9;
  string local_5f8 [39];
  allocator<char> local_5d1;
  string local_5d0 [8];
  TestResult *in_stack_fffffffffffffa38;
  ostream *in_stack_fffffffffffffa40;
  allocator<char> local_5a9;
  TimeInMillis in_stack_fffffffffffffa58;
  allocator<char> local_581;
  string local_580 [39];
  allocator<char> local_559;
  string local_558 [39];
  allocator<char> local_531;
  string local_530 [39];
  allocator<char> local_509;
  string local_508 [39];
  allocator<char> local_4e1;
  string local_4e0 [39];
  allocator<char> local_4b9;
  string local_4b8 [39];
  allocator<char> local_491;
  string local_490 [39];
  allocator<char> local_469;
  string local_468 [39];
  allocator<char> local_441;
  string local_440 [39];
  allocator<char> local_419;
  string local_418 [39];
  allocator<char> local_3f1;
  string local_3f0 [32];
  string local_3d0 [39];
  allocator<char> local_3a9;
  string local_3a8 [39];
  undefined1 local_381 [33];
  string local_360 [39];
  undefined1 local_339 [40];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [39];
  allocator<char> local_1d1;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  TestResult *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"  <testsuite");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                     in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  ms = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                     in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                     in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator(&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                     in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                     in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,in_stack_fffffffffffff890,
                     in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  stream_00 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  element_name = (string *)local_339;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  name = (string *)TestResult::elapsed_time(local_10);
  FormatTimeInMillisAsSeconds_abi_cxx11_((TimeInMillis)ms);
  OutputXmlAttribute(stream_00,element_name,name,in_stack_fffffffffffff888);
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string((string *)(local_339 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  value = (string *)local_381;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  TestResult::start_timestamp(local_10);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(in_stack_fffffffffffffa58);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::string::~string((string *)(local_381 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_381);
  std::operator<<(local_8,">");
  std::operator<<(local_8,"    <testcase");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator(&local_441);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator(&local_491);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator(&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator(&local_531);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator(&local_509);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_5a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffa58);
  std::allocator<char>::~allocator(&local_5a9);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator(&local_581);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator(&local_559);
  __s = &local_5d1;
  __a = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
  TestResult::elapsed_time(local_10);
  FormatTimeInMillisAsSeconds_abi_cxx11_((TimeInMillis)ms);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,(allocator<char> *)__a);
  TestResult::start_timestamp(local_10);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(in_stack_fffffffffffffa58);
  OutputXmlAttribute(stream_00,element_name,name,value);
  std::__cxx11::string::~string(local_690);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator(&local_669);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator(&local_641);
  OutputXmlTestResult(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  std::operator<<(local_8,"  </testsuite>\n");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a minimal test suite with one test.
  *stream << "  <testsuite";
  OutputXmlAttribute(stream, "testsuite", "name", "NonTestSuiteFailure");
  OutputXmlAttribute(stream, "testsuite", "tests", "1");
  OutputXmlAttribute(stream, "testsuite", "failures", "1");
  OutputXmlAttribute(stream, "testsuite", "disabled", "0");
  OutputXmlAttribute(stream, "testsuite", "skipped", "0");
  OutputXmlAttribute(stream, "testsuite", "errors", "0");
  OutputXmlAttribute(stream, "testsuite", "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, "testsuite", "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  *stream << ">";

  // Output the boilerplate for a minimal test case with a single test.
  *stream << "    <testcase";
  OutputXmlAttribute(stream, "testcase", "name", "");
  OutputXmlAttribute(stream, "testcase", "status", "run");
  OutputXmlAttribute(stream, "testcase", "result", "completed");
  OutputXmlAttribute(stream, "testcase", "classname", "");
  OutputXmlAttribute(stream, "testcase", "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, "testcase", "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));

  // Output the actual test result.
  OutputXmlTestResult(stream, result);

  // Complete the test suite.
  *stream << "  </testsuite>\n";
}